

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O0

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_Gudhi::persistent_cohomology::Field_Zp>
::annotation_of_the_boundary
          (Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                 *map_a_ds,Simplex_handle *sigma,int dim_sigma)

{
  int iVar1;
  long lVar2;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *this_00;
  Simplex_handle *this_01;
  type_conflict4 tVar3;
  bool bVar4;
  bool bVar5;
  Simplex_key SVar6;
  Simplex_key SVar7;
  uint uVar8;
  Element EVar9;
  reference other;
  reference ppPVar10;
  iterator iVar11;
  iterator iVar12;
  pointer ppVar13;
  __normal_iterator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_*,_std::vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>_>
  *__lhs;
  reference pPVar14;
  clock_t cVar15;
  pointer ppVar16;
  long *in_FS_OFFSET;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_int>_>::value,_pair<iterator,_bool>_>
  _Var17;
  pair<unsigned_int,_int> local_440;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>,_bool> local_438;
  int local_424;
  undefined1 local_420 [4];
  Arith_element w_y;
  Persistent_cohomology_cell<unsigned_int,_int> cell_ref;
  iterator __end0_1;
  iterator __begin0_1;
  Col_type *__range5;
  int local_3cc;
  Persistent_cohomology_column<unsigned_int,_int> *pPStack_3c8;
  int mult;
  Column *col;
  __normal_iterator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_*,_std::vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>_>
  local_3b8;
  iterator ann_it;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>,_bool> result_insert_a_ds;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_388;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_380;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  sh;
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  __end0;
  undefined1 local_2a0 [8];
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  __begin0;
  iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
  local_1d0;
  iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
  *local_40;
  Boundary_simplex_range *__range3;
  Column *curr_col;
  int local_28;
  Simplex_key key;
  int sign;
  int dim_sigma_local;
  Simplex_handle *sigma_local;
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  *map_a_ds_local;
  Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_Gudhi::persistent_cohomology::Field_Zp>
  *this_local;
  
  key = dim_sigma;
  _sign = sigma;
  sigma_local = (Simplex_handle *)map_a_ds;
  map_a_ds_local =
       (map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
        *)this;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    lVar2 = *in_FS_OFFSET;
    std::
    vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
    ::vector((vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
              *)(lVar2 + -0x20));
    __cxa_thread_atexit(std::
                        vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
                        ::~vector,
                        (vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
                         *)(lVar2 + -0x20),&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
  }
  std::
  vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
  ::clear((vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
           *)(*in_FS_OFFSET + -0x20));
  local_28 = (key - (key - ((int)key >> 0x1f) & 0x7ffffffe)) * -2 + 1;
  this_00 = this->cpx_;
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                  *)&__begin0.st_,sigma);
  Simplex_tree<Gudhi::Simplex_tree_options_default>::
  boundary_simplex_range<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>>
            ((Boundary_simplex_range *)&local_1d0,this_00,
             (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
              *)&__begin0.st_);
  local_40 = &local_1d0;
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
           *)local_2a0,&local_1d0);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
         *)&sh,local_40);
  while (tVar3 = boost::iterators::operator!=
                           ((iterator_facade<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_&,_long>
                             *)local_2a0,
                            (iterator_facade<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_&,_long>
                             *)&sh), tVar3) {
    other = boost::iterators::detail::
            iterator_facade_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_&,_long,_false,_false>
            ::operator*((iterator_facade_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_&,_long,_false,_false>
                         *)local_2a0);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
    ::vec_iterator(&local_380,other);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
    ::vec_iterator(&local_388,&local_380);
    SVar6 = Simplex_tree<Gudhi::Simplex_tree_options_default>::key(&local_388);
    curr_col._4_4_ = SVar6;
    SVar7 = Simplex_tree<Gudhi::Simplex_tree_options_default>::null_key();
    if (SVar6 != SVar7) {
      uVar8 = boost::disjoint_sets<int_*,_unsigned_int_*,_boost::find_with_full_path_compression>::
              find_set<unsigned_int>(&this->dsets_,curr_col._4_4_);
      ppPVar10 = std::
                 vector<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*>_>
                 ::operator[](&this->ds_repr_,(ulong)uVar8);
      __range3 = (Boundary_simplex_range *)*ppPVar10;
      if ((value_type)__range3 != (value_type)0x0) {
        std::
        vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>,std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>>>
        ::
        emplace_back<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*&,int&>
                  ((vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>,std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>>>
                    *)(*in_FS_OFFSET + -0x20),
                   (Persistent_cohomology_column<unsigned_int,_int> **)&__range3,&local_28);
      }
    }
    local_28 = -local_28;
    boost::iterators::detail::
    iterator_facade_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_&,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_&,_long,_false,_false>
                  *)local_2a0);
  }
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  ::~Simplex_tree_boundary_simplex_iterator
            ((Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
              *)&sh);
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  ::~Simplex_tree_boundary_simplex_iterator
            ((Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
              *)local_2a0);
  boost::
  iterator_range<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  ::~iterator_range((iterator_range<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                     *)&local_1d0);
  iVar11 = std::
           vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
           ::begin((vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
                    *)(*in_FS_OFFSET + -0x20));
  iVar12 = std::
           vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
           ::end((vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
                  *)(*in_FS_OFFSET + -0x20));
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>*,std::vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>,std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>>>>,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,Gudhi::persistent_cohomology::Field_Zp>::annotation_of_the_boundary(std::map<unsigned_int,int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>&,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int)::_lambda(std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>const&,std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*,int>const&)_1_>
            (iVar11._M_current,iVar12._M_current);
  std::pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>,_bool>::
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>,_bool,_true>
            ((pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>,_bool> *)&ann_it);
  local_3b8._M_current =
       (pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int> *
       )std::
        vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
        ::begin((vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
                 *)(*in_FS_OFFSET + -0x20));
  while( true ) {
    col = (Column *)
          std::
          vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
          ::end((vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
                 *)(*in_FS_OFFSET + -0x20));
    bVar4 = __gnu_cxx::operator!=
                      (&local_3b8,
                       (__normal_iterator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_*,_std::vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>_>
                        *)&col);
    if (!bVar4) break;
    ppVar13 = __gnu_cxx::
              __normal_iterator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_*,_std::vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>_>
              ::operator->(&local_3b8);
    pPStack_3c8 = ppVar13->first;
    ppVar13 = __gnu_cxx::
              __normal_iterator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_*,_std::vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>_>
              ::operator->(&local_3b8);
    local_3cc = ppVar13->second;
    while( true ) {
      __lhs = __gnu_cxx::
              __normal_iterator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_*,_std::vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>_>
              ::operator++(&local_3b8);
      __range5 = (Col_type *)
                 std::
                 vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
                 ::end((vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>
                        *)(*in_FS_OFFSET + -0x20));
      bVar5 = __gnu_cxx::operator!=
                        (__lhs,(__normal_iterator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_*,_std::vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>_>
                                *)&__range5);
      bVar4 = false;
      if (bVar5) {
        ppVar13 = __gnu_cxx::
                  __normal_iterator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_*,_std::vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>_>
                  ::operator->(&local_3b8);
        bVar4 = ppVar13->first == pPStack_3c8;
      }
      iVar1 = local_3cc;
      if (!bVar4) break;
      ppVar13 = __gnu_cxx::
                __normal_iterator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_*,_std::vector<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>,_std::allocator<std::pair<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_int>_>_>_>
                ::operator->(&local_3b8);
      local_3cc = ppVar13->second + local_3cc;
    }
    EVar9 = Field_Zp::additive_identity(&this->coeff_field_);
    if (iVar1 != EVar9) {
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
      ::begin((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
               *)&__end0_1);
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
      ::end((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
             *)&cell_ref.self_col_);
      while (bVar4 = boost::intrusive::operator!=
                               (&__end0_1,
                                (list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                                 *)&cell_ref.self_col_), bVar4) {
        pPVar14 = boost::intrusive::
                  list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                  ::operator*(&__end0_1);
        Persistent_cohomology_cell<unsigned_int,_int>::Persistent_cohomology_cell
                  ((Persistent_cohomology_cell<unsigned_int,_int> *)local_420,pPVar14);
        cVar15 = Field_Zp::times(&this->coeff_field_,
                                 (tms *)((long)&cell_ref.super_base_hook_cam_v.super_type.super_type
                                                .super_list_node<void_*>.prev_ + 4));
        local_424 = (int)cVar15;
        EVar9 = Field_Zp::additive_identity(&this->coeff_field_);
        this_01 = sigma_local;
        if ((int)cVar15 != EVar9) {
          std::pair<unsigned_int,_int>::pair<unsigned_int_&,_int_&,_true>
                    (&local_440,
                     (uint *)&cell_ref.super_base_hook_cam_v.super_type.super_type.
                              super_list_node<void_*>.prev_,&local_424);
          _Var17 = std::
                   map<unsigned_int,int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
                   ::insert<std::pair<unsigned_int,int>>
                             ((map<unsigned_int,int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
                               *)this_01,&local_440);
          local_438.first = _Var17.first._M_node;
          local_438.second = _Var17.second;
          std::pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>,_bool>::operator=
                    ((pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>,_bool> *)
                     &ann_it,&local_438);
          if (((byte)result_insert_a_ds.first._M_node & 1) == 0) {
            ppVar16 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>::operator->
                                ((_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_> *)&ann_it);
            EVar9 = Field_Zp::plus_equal(&this->coeff_field_,&ppVar16->second,&local_424);
            ppVar16 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>::operator->
                                ((_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_> *)&ann_it);
            ppVar16->second = EVar9;
            ppVar16 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>::operator->
                                ((_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_> *)&ann_it);
            iVar1 = ppVar16->second;
            EVar9 = Field_Zp::additive_identity(&this->coeff_field_);
            if (iVar1 == EVar9) {
              std::
              map<unsigned_int,int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
              ::erase_abi_cxx11_((map<unsigned_int,int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
                                  *)sigma_local,(iterator)ann_it._M_current);
            }
          }
        }
        Persistent_cohomology_cell<unsigned_int,_int>::~Persistent_cohomology_cell
                  ((Persistent_cohomology_cell<unsigned_int,_int> *)local_420);
        boost::intrusive::
        list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
        ::operator++(&__end0_1);
      }
    }
  }
  return;
}

Assistant:

void annotation_of_the_boundary(
      std::map<Simplex_key, Arith_element> & map_a_ds, Simplex_handle sigma,
      int dim_sigma) {
    // traverses the boundary of sigma, keeps track of the annotation vectors,
    // with multiplicity. We used to sum the coefficients directly in
    // annotations_in_boundary by using a map, we now do it later.
    typedef std::pair<Column *, int> annotation_t;
    thread_local std::vector<annotation_t> annotations_in_boundary;
    annotations_in_boundary.clear();
    int sign = 1 - 2 * (dim_sigma % 2);  // \in {-1,1} provides the sign in the
                                         // alternate sum in the boundary.
    Simplex_key key;
    Column * curr_col;

    for (auto sh : cpx_->boundary_simplex_range(sigma)) {
      key = cpx_->key(sh);
      if (key != cpx_->null_key()) {  // A simplex with null_key is a killer, and have null annotation
        // Find its annotation vector
        curr_col = ds_repr_[dsets_.find_set(key)];
        if (curr_col != NULL) {  // and insert it in annotations_in_boundary with multyiplicative factor "sign".
          annotations_in_boundary.emplace_back(curr_col, sign);
        }
      }
      sign = -sign;
    }
    // Place identical annotations consecutively so we can easily sum their multiplicities.
    std::sort(annotations_in_boundary.begin(), annotations_in_boundary.end(),
              [](annotation_t const& a, annotation_t const& b) { return a.first < b.first; });

    // Sum the annotations with multiplicity, using a map<key,coeff>
    // to represent a sparse vector.
    std::pair<typename std::map<Simplex_key, Arith_element>::iterator, bool> result_insert_a_ds;

    for (auto ann_it = annotations_in_boundary.begin(); ann_it != annotations_in_boundary.end(); /**/) {
      Column* col = ann_it->first;
      int mult = ann_it->second;
      while (++ann_it != annotations_in_boundary.end() && ann_it->first == col) {
        mult += ann_it->second;
      }
      // The following test is just a heuristic, it is not required, and it is fine that is misses p == 0.
      if (mult != coeff_field_.additive_identity()) {  // For all columns in the boundary,
        for (auto cell_ref : col->col_) {  // insert every cell in map_a_ds with multiplicity
          Arith_element w_y = coeff_field_.times(cell_ref.coefficient_, mult);  // coefficient * multiplicity

          if (w_y != coeff_field_.additive_identity()) {  // if != 0
            result_insert_a_ds = map_a_ds.insert(std::pair<Simplex_key, Arith_element>(cell_ref.key_, w_y));
            if (!(result_insert_a_ds.second)) {  // if cell_ref.key_ already a Key in map_a_ds
              result_insert_a_ds.first->second = coeff_field_.plus_equal(result_insert_a_ds.first->second, w_y);
              if (result_insert_a_ds.first->second == coeff_field_.additive_identity()) {
                map_a_ds.erase(result_insert_a_ds.first);
              }
            }
          }
        }
      }
    }
  }